

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_common.hpp
# Opt level: O2

void __thiscall
afsm::test::state_name::
on_enter<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>
          (state_name *this,none *param_1,
          inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
          *param_2)

{
  long lVar1;
  ostream *poVar2;
  string asStack_38 [32];
  
  poVar2 = psst::operator<<((ostream *)&std::cerr,red);
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x11;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x20;
  poVar2 = std::operator<<(poVar2,"[default]");
  poVar2 = psst::operator<<(poVar2,clear);
  poVar2 = std::operator<<(poVar2,": Enter ");
  (*this->_vptr_state_name[2])(asStack_38,this);
  poVar2 = std::operator<<(poVar2,asStack_38);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

void
    on_enter(none&&, FSM&)
    {
        using ::psst::ansi_color;
        ::std::cerr
                << ansi_color::red
                << ::std::setw(event_name_width) << ::std::left
                << "[default]" << ansi_color::clear
                << ": Enter " << name() << "\n";
    }